

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_Spawn(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret
                   ,int numret)

{
  double type_00;
  VMValue *pVVar1;
  bool bVar2;
  bool local_91;
  PClass *local_90;
  TVector3<double> local_80;
  AActor *local_68;
  AActor *state;
  VMValue *pVStack_58;
  int flags;
  double z;
  double y;
  double x;
  MetaClass *type;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  type._0_4_ = 0;
  type._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1246,"int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    if ((param->field_0).field_1.a == (void *)0x0) {
      NullParam("\"type\"");
      local_90 = (PClass *)defaultparam_local[(int)type].Array;
    }
    else {
      local_90 = (PClass *)(param->field_0).f;
    }
    x = (double)local_90;
    local_91 = true;
    if (local_90 != (PClass *)0x0) {
      local_91 = PClass::IsDescendantOf(local_90,AActor::RegistrationInfo.MyClass);
    }
    if (local_91 != false) {
      type._0_4_ = (int)type + 1;
      if ((int)type < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)type].Count != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1247,
                        "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        y = (double)defaultparam_local[(int)type].Array;
      }
      else {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)type);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1247,
                        "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)type);
        y = (pVVar1->field_0).f;
      }
      type._0_4_ = (int)type + 1;
      if ((int)type < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)type].Count != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1248,
                        "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        z = (double)defaultparam_local[(int)type].Array;
      }
      else {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)type);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1248,
                        "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)type);
        z = (pVVar1->field_0).f;
      }
      type._0_4_ = (int)type + 1;
      if ((int)type < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)type].Count != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1249,
                        "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        pVStack_58 = defaultparam_local[(int)type].Array;
      }
      else {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)type);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1249,
                        "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)type);
        pVStack_58 = (VMValue *)(pVVar1->field_0).f;
      }
      type._0_4_ = (int)type + 1;
      if ((int)type < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)type].Count != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x124a,
                        "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        state._4_4_ = *(replace_t *)&defaultparam_local[(int)type].Array;
      }
      else {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)type);
        if ((pVVar1->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x124a,
                        "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)type);
        state._4_4_ = (pVVar1->field_0).i;
      }
      type_00 = x;
      TVector3<double>::TVector3(&local_80,y,z,(double)pVStack_58);
      local_68 = AActor::StaticSpawn((PClassActor *)type_00,&local_80,state._4_4_,false);
      if (type._4_4_ < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (_paramnum == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x124b,
                        "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        VMReturn::SetPointer(_paramnum,local_68,1);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1246,"int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1246,"int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Spawn)
{
	PARAM_PROLOGUE;
	PARAM_CLASS_NOT_NULL(type, AActor);
	PARAM_FLOAT_DEF(x);
	PARAM_FLOAT_DEF(y);
	PARAM_FLOAT_DEF(z);
	PARAM_INT_DEF(flags);
	ACTION_RETURN_OBJECT(AActor::StaticSpawn(type, DVector3(x, y, z), replace_t(flags)));
}